

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClosePopupsOverWindow(ImGuiWindow *ref_window,bool restore_focus_to_window_under_popup)

{
  ImGuiContext *pIVar1;
  ImGuiPopupData *pIVar2;
  long in_RDI;
  ImGuiWindow *popup_window;
  int n;
  bool ref_window_is_descendent_of_popup;
  ImGuiPopupData *popup;
  int popup_count_to_keep;
  ImGuiContext *g;
  ImGuiWindow *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  undefined1 in_stack_ffffffffffffffe3;
  int iVar3;
  int remaining;
  
  pIVar1 = GImGui;
  if ((GImGui->OpenPopupStack).Size != 0) {
    iVar3 = 0;
    remaining = iVar3;
    if (in_RDI != 0) {
      for (; remaining = iVar3, iVar3 < (pIVar1->OpenPopupStack).Size; iVar3 = iVar3 + 1) {
        pIVar2 = ImVector<ImGuiPopupData>::operator[]
                           ((ImVector<ImGuiPopupData> *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
        if (pIVar2->Window != (ImGuiWindow *)0x0) {
          if ((pIVar2->Window->Flags & 0x4000000U) == 0) {
            __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                          ,0x1f98,"void ImGui::ClosePopupsOverWindow(ImGuiWindow *, bool)");
          }
          if ((pIVar2->Window->Flags & 0x1000000U) == 0) {
            in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 & 0xffffff;
            remaining = iVar3;
            for (; iVar3 < (pIVar1->OpenPopupStack).Size; iVar3 = iVar3 + 1) {
              pIVar2 = ImVector<ImGuiPopupData>::operator[]
                                 ((ImVector<ImGuiPopupData> *)
                                  CONCAT44(in_stack_ffffffffffffffd4,iVar3),
                                  (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
              in_stack_ffffffffffffffc8 = pIVar2->Window;
              if ((in_stack_ffffffffffffffc8 != (ImGuiWindow *)0x0) &&
                 (in_stack_ffffffffffffffc8->RootWindow == *(ImGuiWindow **)(in_RDI + 0x390))) {
                in_stack_ffffffffffffffd4 = CONCAT13(1,(int3)in_stack_ffffffffffffffd4);
                break;
              }
            }
            in_stack_ffffffffffffffd0 = iVar3;
            iVar3 = remaining;
            if ((in_stack_ffffffffffffffd4 & 0x1000000) == 0) break;
          }
        }
      }
    }
    if (remaining < (pIVar1->OpenPopupStack).Size) {
      ClosePopupToLevel(remaining,(bool)in_stack_ffffffffffffffe3);
    }
  }
  return;
}

Assistant:

void ImGui::ClosePopupsOverWindow(ImGuiWindow* ref_window, bool restore_focus_to_window_under_popup)
{
    ImGuiContext& g = *GImGui;
    if (g.OpenPopupStack.Size == 0)
        return;

    // Don't close our own child popup windows.
    int popup_count_to_keep = 0;
    if (ref_window)
    {
        // Find the highest popup which is a descendant of the reference window (generally reference window = NavWindow)
        for (; popup_count_to_keep < g.OpenPopupStack.Size; popup_count_to_keep++)
        {
            ImGuiPopupData& popup = g.OpenPopupStack[popup_count_to_keep];
            if (!popup.Window)
                continue;
            IM_ASSERT((popup.Window->Flags & ImGuiWindowFlags_Popup) != 0);
            if (popup.Window->Flags & ImGuiWindowFlags_ChildWindow)
                continue;

            // Trim the stack unless the popup is a direct parent of the reference window (the reference window is often the NavWindow)
            // - With this stack of window, clicking/focusing Popup1 will close Popup2 and Popup3:
            //     Window -> Popup1 -> Popup2 -> Popup3
            // - Each popups may contain child windows, which is why we compare ->RootWindow!
            //     Window -> Popup1 -> Popup1_Child -> Popup2 -> Popup2_Child
            bool ref_window_is_descendent_of_popup = false;
            for (int n = popup_count_to_keep; n < g.OpenPopupStack.Size; n++)
                if (ImGuiWindow* popup_window = g.OpenPopupStack[n].Window)
                    if (popup_window->RootWindow == ref_window->RootWindow)
                    {
                        ref_window_is_descendent_of_popup = true;
                        break;
                    }
            if (!ref_window_is_descendent_of_popup)
                break;
        }
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
    {
        IMGUI_DEBUG_LOG_POPUP("ClosePopupsOverWindow(\"%s\") -> ClosePopupToLevel(%d)\n", ref_window->Name, popup_count_to_keep);
        ClosePopupToLevel(popup_count_to_keep, restore_focus_to_window_under_popup);
    }
}